

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_handle.cpp
# Opt level: O1

SysCallInt32Result cppnet::OsHandle::Bind(int64_t sockfd,Address *address)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  socklen_t __len;
  sockaddr_in addr;
  sockaddr local_28;
  undefined4 uStack_18;
  undefined8 uStack_14;
  
  if (address->_address_type == AT_IPV4) {
    local_28.sa_data[6] = '\0';
    local_28.sa_data[7] = '\0';
    local_28.sa_data[8] = '\0';
    local_28.sa_data[9] = '\0';
    local_28.sa_data[10] = '\0';
    local_28.sa_data[0xb] = '\0';
    local_28.sa_data[0xc] = '\0';
    local_28.sa_data[0xd] = '\0';
    local_28.sa_data._0_2_ = address->_port << 8 | address->_port >> 8;
    local_28.sa_family = 2;
    local_28.sa_data._2_4_ = 0;
    inet_pton(2,(address->_ip)._M_dataplus._M_p,local_28.sa_data + 2);
    __len = 0x10;
  }
  else {
    local_28.sa_data[6] = '\0';
    local_28.sa_data[7] = '\0';
    local_28.sa_data[8] = '\0';
    local_28.sa_data[9] = '\0';
    local_28.sa_data[10] = '\0';
    local_28.sa_data[0xb] = '\0';
    local_28.sa_data[0xc] = '\0';
    local_28.sa_data[0xd] = '\0';
    uStack_18 = 0;
    uStack_14 = 0;
    local_28.sa_data._0_2_ = address->_port << 8 | address->_port >> 8;
    local_28.sa_family = 10;
    local_28.sa_data._2_4_ = 0;
    inet_pton(10,(address->_ip)._M_dataplus._M_p,local_28.sa_data + 6);
    __len = 0x1c;
  }
  uVar1 = bind((int)sockfd,&local_28,__len);
  if ((int)uVar1 < 0) {
    puVar2 = (uint *)__errno_location();
    uVar3 = (ulong)*puVar2 << 0x20;
  }
  else {
    uVar3 = 0;
  }
  return (SysCallInt32Result)(uVar1 | uVar3);
}

Assistant:

SysCallInt32Result OsHandle::Bind(int64_t sockfd, Address& address) {
    int32_t ret = -1;
    if (address.GetType() == AT_IPV4) {
        struct sockaddr_in addr;
        memset(&addr, 0, sizeof(addr));

        addr.sin_family = AF_INET;
        addr.sin_port = htons(address.GetAddrPort());
        inet_pton(AF_INET, address.GetIp().c_str(), &addr.sin_addr);
        ret = bind(sockfd, (sockaddr *)&addr, sizeof(sockaddr_in));

    } else {
        struct sockaddr_in6 addr;
        memset(&addr, 0, sizeof(addr));

        addr.sin6_family = AF_INET6;
        addr.sin6_port = htons(address.GetAddrPort());
        inet_pton(AF_INET6, address.GetIp().c_str(), &addr.sin6_addr);
        ret = bind(sockfd, (sockaddr*)&addr, sizeof(sockaddr_in6));
    }

    if (ret < 0) {
        return {ret, errno};
    }
    return {ret, 0};
}